

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O1

bool Eval::initPatterns(void)

{
  unsigned_short *puVar1;
  byte bVar2;
  unsigned_short uVar3;
  bool bVar4;
  int i_1;
  int (*paiVar5) [46];
  int i;
  int iVar6;
  int j;
  int *piVar7;
  unsigned_short (*pauVar8) [46];
  long lVar9;
  int (*paiVar10) [46];
  int k;
  long lVar11;
  int l;
  long lVar12;
  int j_1;
  int k_1;
  long lVar13;
  unsigned_short (*paauVar14) [8] [46];
  int tempOffset [11];
  int aiStack_68 [14];
  
  lVar13 = 0;
  deltaSum = (float *)0x0;
  occurance = (int *)0x0;
  patternValues = (int *)operator_new__(0xad8dc4);
  paauVar14 = myPV;
  memset(myPV,0,0x2e000);
  memset(pPtr,0,0x17000);
  memset(pVCount,0,0x800);
  memset(posDepend,0,0x2e00);
  memset(patternDependCount,0,0xb8);
  iVar6 = 0;
  do {
    *(int *)((long)aiStack_68 + lVar13) = iVar6;
    iVar6 = iVar6 + *(int *)((long)patternCount + lVar13);
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x2c);
  paiVar5 = patternOffset;
  lVar13 = 0;
  do {
    lVar9 = 0;
    do {
      *(int *)((long)*paiVar5 + lVar9) =
           aiStack_68[*(int *)((long)patternPtr + lVar9)] + (int)lVar13 * 0x28d61;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0xb8);
    lVar13 = lVar13 + 1;
    paiVar5 = paiVar5 + 1;
  } while (lVar13 != 0x11);
  bVar4 = loadPatterns();
  if (bVar4) {
    posDepend[9][0] = pow3[patternDependCount[0]];
    piVar7 = pow3 + (patternDependCount[0] + 1);
    lVar13 = (long)(patternDependCount[0] + 1) << 0x20;
    patternDependCount[0] = patternDependCount[0] + 2;
    lVar9 = 0;
    do {
      *(int *)((long)posDepend[0] + lVar9) = *piVar7;
      lVar9 = lVar9 + 0xb8;
      piVar7 = piVar7 + 1;
      lVar13 = lVar13 + 0x100000000;
      patternDependCount[0] = patternDependCount[0] + 1;
    } while (lVar9 != 0x5c0);
    posDepend[0xe][0] = *(int *)((long)pow3 + (lVar13 >> 0x1e));
    posDepend[0x31][1] = pow3[patternDependCount[1]];
    lVar13 = (long)(patternDependCount[1] + 1) << 0x20;
    piVar7 = posDepend[0x38] + 1;
    lVar9 = 0;
    do {
      *piVar7 = pow3[lVar9 + (patternDependCount[1] + 1)];
      piVar7 = piVar7 + -0x170;
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 0x100000000;
    } while ((int)lVar9 != 8);
    patternDependCount[1] = patternDependCount[1] + 10;
    posDepend[9][1] = *(int *)((long)pow3 + (lVar13 >> 0x1e));
    posDepend[0x36][2] = pow3[patternDependCount[2]];
    lVar13 = (long)(patternDependCount[2] + 1) << 0x20;
    piVar7 = posDepend[0x3f] + 2;
    lVar9 = 0;
    do {
      *piVar7 = pow3[lVar9 + (patternDependCount[2] + 1)];
      piVar7 = piVar7 + -0x2e;
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 0x100000000;
    } while ((int)lVar9 != 8);
    patternDependCount[2] = patternDependCount[2] + 10;
    posDepend[0x31][2] = *(int *)((long)pow3 + (lVar13 >> 0x1e));
    posDepend[0xe][3] = pow3[patternDependCount[3]];
    lVar13 = (long)(patternDependCount[3] + 1) << 0x20;
    piVar7 = posDepend[7] + 3;
    lVar9 = 0;
    do {
      *piVar7 = pow3[lVar9 + (patternDependCount[3] + 1)];
      piVar7 = piVar7 + 0x170;
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 0x100000000;
    } while ((int)lVar9 != 8);
    patternDependCount[3] = patternDependCount[3] + 10;
    posDepend[0x36][3] = *(int *)((long)pow3 + (lVar13 >> 0x1e));
    piVar7 = posDepend[8] + 4;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[4]];
      piVar7 = piVar7 + 0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[4] = patternDependCount[4] + 8;
    piVar7 = posDepend[0x39] + 5;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[5]];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[5] = patternDependCount[5] + 8;
    piVar7 = posDepend[0x37] + 6;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[6]];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[6] = patternDependCount[6] + 8;
    piVar7 = posDepend[6] + 7;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[7]];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[7] = patternDependCount[7] + 8;
    piVar7 = posDepend[0x10] + 8;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[8]];
      piVar7 = piVar7 + 0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[8] = patternDependCount[8] + 8;
    piVar7 = posDepend[0x3a] + 9;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[9]];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[9] = patternDependCount[9] + 8;
    piVar7 = posDepend[0x2f] + 10;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[10]];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[10] = patternDependCount[10] + 8;
    piVar7 = posDepend[5] + 0xb;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0xb]];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[0xb] = patternDependCount[0xb] + 8;
    piVar7 = posDepend[0x18] + 0xc;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0xc]];
      piVar7 = piVar7 + 0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[0xc] = patternDependCount[0xc] + 8;
    piVar7 = posDepend[0x3b] + 0xd;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0xd]];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[0xd] = patternDependCount[0xd] + 8;
    piVar7 = posDepend[0x27] + 0xe;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0xe]];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[0xe] = patternDependCount[0xe] + 8;
    piVar7 = posDepend[4] + 0xf;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0xf]];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[0xf] = patternDependCount[0xf] + 8;
    piVar7 = posDepend[0] + 0x10;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x10]];
      piVar7 = piVar7 + 0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[0x10] = patternDependCount[0x10] + 8;
    piVar7 = posDepend[0x38] + 0x11;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x11]];
      piVar7 = piVar7 + -0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    patternDependCount[0x11] = patternDependCount[0x11] + 8;
    piVar7 = posDepend[8] + 0x12;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x12]];
      piVar7 = piVar7 + 0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 7);
    patternDependCount[0x12] = patternDependCount[0x12] + 7;
    piVar7 = posDepend[0x39] + 0x13;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x13]];
      piVar7 = piVar7 + -0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 7);
    patternDependCount[0x13] = patternDependCount[0x13] + 7;
    piVar7 = posDepend[0x37] + 0x14;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x14]];
      piVar7 = piVar7 + -0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 7);
    patternDependCount[0x14] = patternDependCount[0x14] + 7;
    piVar7 = posDepend[6] + 0x15;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x15]];
      piVar7 = piVar7 + 0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 7);
    patternDependCount[0x15] = patternDependCount[0x15] + 7;
    piVar7 = posDepend[0x10] + 0x16;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x16]];
      piVar7 = piVar7 + 0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 6);
    patternDependCount[0x16] = patternDependCount[0x16] + 6;
    piVar7 = posDepend[0x3a] + 0x17;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x17]];
      piVar7 = piVar7 + -0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 6);
    patternDependCount[0x17] = patternDependCount[0x17] + 6;
    piVar7 = posDepend[0x2f] + 0x18;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x18]];
      piVar7 = piVar7 + -0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 6);
    patternDependCount[0x18] = patternDependCount[0x18] + 6;
    piVar7 = posDepend[5] + 0x19;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x19]];
      piVar7 = piVar7 + 0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 6);
    patternDependCount[0x19] = patternDependCount[0x19] + 6;
    piVar7 = posDepend[0x18] + 0x1a;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x1a]];
      piVar7 = piVar7 + 0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    patternDependCount[0x1a] = patternDependCount[0x1a] + 5;
    piVar7 = posDepend[0x3b] + 0x1b;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x1b]];
      piVar7 = piVar7 + -0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    patternDependCount[0x1b] = patternDependCount[0x1b] + 5;
    piVar7 = posDepend[0x27] + 0x1c;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x1c]];
      piVar7 = piVar7 + -0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    patternDependCount[0x1c] = patternDependCount[0x1c] + 5;
    piVar7 = posDepend[4] + 0x1d;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x1d]];
      piVar7 = piVar7 + 0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    patternDependCount[0x1d] = patternDependCount[0x1d] + 5;
    piVar7 = posDepend[0x20] + 0x1e;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x1e]];
      piVar7 = piVar7 + 0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 4);
    patternDependCount[0x1e] = patternDependCount[0x1e] + 4;
    piVar7 = posDepend[0x3c] + 0x1f;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x1f]];
      piVar7 = piVar7 + -0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 4);
    patternDependCount[0x1f] = patternDependCount[0x1f] + 4;
    piVar7 = posDepend[0x1f] + 0x20;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x20]];
      piVar7 = piVar7 + -0x19e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 4);
    patternDependCount[0x20] = patternDependCount[0x20] + 4;
    piVar7 = posDepend[3] + 0x21;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x21]];
      piVar7 = piVar7 + 0x142;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 4);
    patternDependCount[0x21] = patternDependCount[0x21] + 4;
    piVar7 = posDepend[0] + 0x22;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x22]];
      lVar13 = lVar13 + 1;
      piVar7 = piVar7 + 0x2e;
    } while (lVar13 != 5);
    iVar6 = patternDependCount[0x22] + 5;
    patternDependCount[0x22] = patternDependCount[0x22] + 5;
    piVar7 = posDepend[8] + 0x22;
    lVar13 = 0;
    do {
      *piVar7 = *(int *)((long)pow3 + (long)iVar6 * 4 + lVar13);
      piVar7 = piVar7 + 0x2e;
      lVar13 = lVar13 + 4;
      patternDependCount[0x22] = patternDependCount[0x22] + 1;
    } while ((int)lVar13 != 0x14);
    piVar7 = posDepend[0x38] + 0x23;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x23]];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    iVar6 = patternDependCount[0x23] + 5;
    patternDependCount[0x23] = patternDependCount[0x23] + 5;
    piVar7 = posDepend[0x39] + 0x23;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
      patternDependCount[0x23] = patternDependCount[0x23] + 1;
    } while ((int)lVar13 != 5);
    piVar7 = posDepend[0x3f] + 0x24;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x24]];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    iVar6 = patternDependCount[0x24] + 5;
    patternDependCount[0x24] = patternDependCount[0x24] + 5;
    piVar7 = posDepend[0x37] + 0x24;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
      patternDependCount[0x24] = patternDependCount[0x24] + 1;
    } while ((int)lVar13 != 5);
    piVar7 = posDepend[7] + 0x25;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x25]];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    iVar6 = patternDependCount[0x25] + 5;
    patternDependCount[0x25] = patternDependCount[0x25] + 5;
    piVar7 = posDepend[6] + 0x25;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
      patternDependCount[0x25] = patternDependCount[0x25] + 1;
    } while ((int)lVar13 != 5);
    piVar7 = posDepend[0] + 0x26;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x26]];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    iVar6 = patternDependCount[0x26] + 5;
    patternDependCount[0x26] = patternDependCount[0x26] + 5;
    piVar7 = posDepend[1] + 0x26;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
      patternDependCount[0x26] = patternDependCount[0x26] + 1;
    } while ((int)lVar13 != 5);
    piVar7 = posDepend[0x38] + 0x27;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x27]];
      piVar7 = piVar7 + 0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    iVar6 = patternDependCount[0x27] + 5;
    patternDependCount[0x27] = patternDependCount[0x27] + 5;
    piVar7 = posDepend[0x30] + 0x27;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + 0x2e;
      lVar13 = lVar13 + 1;
      patternDependCount[0x27] = patternDependCount[0x27] + 1;
    } while ((int)lVar13 != 5);
    piVar7 = posDepend[0x3f] + 0x28;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x28]];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    iVar6 = patternDependCount[0x28] + 5;
    patternDependCount[0x28] = patternDependCount[0x28] + 5;
    piVar7 = posDepend[0x3e] + 0x28;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
      patternDependCount[0x28] = patternDependCount[0x28] + 1;
    } while ((int)lVar13 != 5);
    piVar7 = posDepend[7] + 0x29;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x29]];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 5);
    iVar6 = patternDependCount[0x29] + 5;
    patternDependCount[0x29] = patternDependCount[0x29] + 5;
    piVar7 = posDepend[0xf] + 0x29;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
      patternDependCount[0x29] = patternDependCount[0x29] + 1;
    } while ((int)lVar13 != 5);
    piVar7 = posDepend[0] + 0x2a;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x2a]];
      lVar13 = lVar13 + 1;
      piVar7 = piVar7 + 0x2e;
    } while (lVar13 != 3);
    iVar6 = patternDependCount[0x2a] + 3;
    patternDependCount[0x2a] = patternDependCount[0x2a] + 3;
    piVar7 = posDepend[8] + 0x2a;
    lVar13 = 0;
    do {
      *piVar7 = *(int *)((long)pow3 + (long)iVar6 * 4 + lVar13);
      piVar7 = piVar7 + 0x2e;
      lVar13 = lVar13 + 4;
      patternDependCount[0x2a] = patternDependCount[0x2a] + 1;
    } while ((int)lVar13 != 0xc);
    lVar13 = (long)patternDependCount[0x2a];
    piVar7 = posDepend[0x10] + 0x2a;
    lVar9 = 0;
    do {
      *piVar7 = pow3[lVar9 + lVar13];
      piVar7 = piVar7 + 0x2e;
      lVar9 = lVar9 + 1;
      patternDependCount[0x2a] = patternDependCount[0x2a] + 1;
    } while ((int)lVar9 != 3);
    piVar7 = posDepend[0x38] + 0x2b;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x2b]];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 3);
    iVar6 = patternDependCount[0x2b] + 3;
    patternDependCount[0x2b] = patternDependCount[0x2b] + 3;
    piVar7 = posDepend[0x39] + 0x2b;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + -0x170;
      lVar13 = lVar13 + 1;
      patternDependCount[0x2b] = patternDependCount[0x2b] + 1;
    } while ((int)lVar13 != 3);
    lVar13 = (long)patternDependCount[0x2b];
    piVar7 = posDepend[0x3a] + 0x2b;
    lVar9 = 0;
    do {
      *piVar7 = pow3[lVar9 + lVar13];
      piVar7 = piVar7 + -0x170;
      lVar9 = lVar9 + 1;
      patternDependCount[0x2b] = patternDependCount[0x2b] + 1;
    } while ((int)lVar9 != 3);
    piVar7 = posDepend[0x3f] + 0x2c;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x2c]];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 3);
    iVar6 = patternDependCount[0x2c] + 3;
    patternDependCount[0x2c] = patternDependCount[0x2c] + 3;
    piVar7 = posDepend[0x37] + 0x2c;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + -0x2e;
      lVar13 = lVar13 + 1;
      patternDependCount[0x2c] = patternDependCount[0x2c] + 1;
    } while ((int)lVar13 != 3);
    lVar13 = (long)patternDependCount[0x2c];
    piVar7 = posDepend[0x2f] + 0x2c;
    lVar9 = 0;
    do {
      *piVar7 = pow3[lVar9 + lVar13];
      piVar7 = piVar7 + -0x2e;
      lVar9 = lVar9 + 1;
      patternDependCount[0x2c] = patternDependCount[0x2c] + 1;
    } while ((int)lVar9 != 3);
    piVar7 = posDepend[7] + 0x2d;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + patternDependCount[0x2d]];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 3);
    iVar6 = patternDependCount[0x2d] + 3;
    patternDependCount[0x2d] = patternDependCount[0x2d] + 3;
    piVar7 = posDepend[6] + 0x2d;
    lVar13 = 0;
    do {
      *piVar7 = pow3[lVar13 + iVar6];
      piVar7 = piVar7 + 0x170;
      lVar13 = lVar13 + 1;
      patternDependCount[0x2d] = patternDependCount[0x2d] + 1;
    } while ((int)lVar13 != 3);
    lVar13 = (long)patternDependCount[0x2d];
    piVar7 = posDepend[5] + 0x2d;
    lVar9 = 0;
    do {
      *piVar7 = pow3[lVar9 + lVar13];
      piVar7 = piVar7 + 0x170;
      lVar9 = lVar9 + 1;
      patternDependCount[0x2d] = patternDependCount[0x2d] + 1;
    } while ((int)lVar9 != 3);
    lVar13 = 0;
    do {
      paiVar5 = posDepend;
      lVar9 = 0;
      do {
        if (((uint)lVar13 >> ((byte)(7 - (char)lVar9) & 0x1f) & 1) != 0) {
          lVar11 = 0;
          pauVar8 = *paauVar14;
          paiVar10 = paiVar5;
          do {
            lVar12 = 0;
            do {
              puVar1 = *(unsigned_short (*) [46])*pauVar8 + lVar12;
              *puVar1 = *puVar1 + (short)(*paiVar10)[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0x2e);
            lVar11 = lVar11 + 1;
            paiVar10 = paiVar10 + 8;
            pauVar8 = pauVar8 + 1;
          } while (lVar11 != 8);
        }
        lVar9 = lVar9 + 1;
        paiVar5 = paiVar5 + 1;
      } while (lVar9 != 8);
      lVar13 = lVar13 + 1;
      paauVar14 = (unsigned_short (*) [8] [46])((long)paauVar14 + 0x2e0);
    } while (lVar13 != 0x100);
    lVar13 = 0;
    paauVar14 = myPV;
    do {
      lVar9 = 0;
      pauVar8 = *paauVar14;
      do {
        lVar11 = 0;
        do {
          uVar3 = (*(unsigned_short (*) [46])*pauVar8)[lVar11];
          if (uVar3 != 0) {
            bVar2 = pVCount[lVar13][lVar9];
            pPtr[lVar13][lVar9][bVar2] = (uchar)lVar11;
            pVCount[lVar13][lVar9] = bVar2 + 1;
            myPV[lVar13][lVar9][bVar2] = uVar3;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x2e);
        lVar9 = lVar9 + 1;
        pauVar8 = pauVar8 + 1;
      } while (lVar9 != 8);
      lVar13 = lVar13 + 1;
      paauVar14 = (unsigned_short (*) [8] [46])((long)paauVar14 + 0x2e0);
    } while (lVar13 != 0x100);
  }
  else {
    if (patternValues != (int *)0x0) {
      operator_delete__(patternValues);
    }
    patternValues = (int *)0x0;
  }
  return bVar4;
}

Assistant:

bool Eval::initPatterns() {
    deltaSum = 0;
    occurance = 0;
    patternValues = new int[ALL_STAGE_PATTERN_COUNT];

    memset(myPV, 0, sizeof(myPV));
    //memset(opPV, 0, sizeof(opPV));
    memset(pPtr, 0, sizeof(pPtr));
    memset(pVCount, 0, sizeof(pVCount));
    memset(posDepend, 0, sizeof(posDepend));
    memset(patternDependCount, 0, sizeof(patternDependCount));
    int tempOffset[PATTERNS];
    int offset = 0;
    for (int i = 0; i < PATTERNS; i++) {
        tempOffset[i] = offset;
        offset += patternCount[i];
    }
    for (int i = 0; i < STAGES; i++) {
        offset = i * TOTAL_PATTERN_COUNT;
        for (int j = 0; j < ACTUAL_PATTERNS; j++) {
            patternOffset[i][j] = offset + tempOffset[patternPtr[j]];
        }
    }
    if (!loadPatterns()) {
        delete[] patternValues;
        patternValues = nullptr;
        return false;
    };
    {
        // line 1 + 2X
        addDependency(9, 0);
        multipleAdd(0, 1, 8, 0);
        addDependency(14, 0);

        addDependency(49, 1);
        multipleAdd(56, -8, 8, 1);
        addDependency(9, 1);

        addDependency(54, 2);
        multipleAdd(63, -1, 8, 2);
        addDependency(49, 2);

        addDependency(14, 3);
        multipleAdd(7, 8, 8, 3);
        addDependency(54, 3);

        // line 2
        multipleAdd(8, 1, 8, 4);
        multipleAdd(57, -8, 8, 5);
        multipleAdd(55, -1, 8, 6);
        multipleAdd(6, 8, 8, 7);

        // line 3
        multipleAdd(16, 1, 8, 8);
        multipleAdd(58, -8, 8, 9);
        multipleAdd(47, -1, 8, 10);
        multipleAdd(5, 8, 8, 11);

        // line 4
        multipleAdd(24, 1, 8, 12);
        multipleAdd(59, -8, 8, 13);
        multipleAdd(39, -1, 8, 14);
        multipleAdd(4, 8, 8, 15);

        // diag 8
        multipleAdd(0, 9, 8, 16);
        multipleAdd(56, -7, 8, 17);

        // diag 7
        multipleAdd(8, 9, 7, 18);
        multipleAdd(57, -7, 7, 19);
        multipleAdd(55, -9, 7, 20);
        multipleAdd(6, 7, 7, 21);

        // diag 6
        multipleAdd(16, 9, 6, 22);
        multipleAdd(58, -7, 6, 23);
        multipleAdd(47, -9, 6, 24);
        multipleAdd(5, 7, 6, 25);

        // diag 5
        multipleAdd(24, 9, 5, 26);
        multipleAdd(59, -7, 5, 27);
        multipleAdd(39, -9, 5, 28);
        multipleAdd(4, 7, 5, 29);

        // diag 4
        multipleAdd(32, 9, 4, 30);
        multipleAdd(60, -7, 4, 31);
        multipleAdd(31, -9, 4, 32);
        multipleAdd(3, 7, 4, 33);

        // 2x5 square
        multipleAdd(0, 1, 5, 34);
        multipleAdd(8, 1, 5, 34);

        multipleAdd(56, -8, 5, 35);
        multipleAdd(57, -8, 5, 35);

        multipleAdd(63, -1, 5, 36);
        multipleAdd(55, -1, 5, 36);

        multipleAdd(7, 8, 5, 37);
        multipleAdd(6, 8, 5, 37);

        multipleAdd(0, 8, 5, 38);
        multipleAdd(1, 8, 5, 38);

        multipleAdd(56, 1, 5, 39);
        multipleAdd(48, 1, 5, 39);

        multipleAdd(63, -8, 5, 40);
        multipleAdd(62, -8, 5, 40);

        multipleAdd(7, -1, 5, 41);
        multipleAdd(15, -1, 5, 41);

        // 3x3 square
        multipleAdd(0, 1, 3, 42);
        multipleAdd(8, 1, 3, 42);
        multipleAdd(16, 1, 3, 42);

        multipleAdd(56, -8, 3, 43);
        multipleAdd(57, -8, 3, 43);
        multipleAdd(58, -8, 3, 43);

        multipleAdd(63, -1, 3, 44);
        multipleAdd(55, -1, 3, 44);
        multipleAdd(47, -1, 3, 44);

        multipleAdd(7, 8, 3, 45);
        multipleAdd(6, 8, 3, 45);
        multipleAdd(5, 8, 3, 45);
    }

    for (int i = 0; i < 256; i++)
        for (int j = 0; j < 8; j++)
            if (i & (1 << (7 - j)))
                for (int k = 0; k < 8; k++)
                    for (int l = 0; l < ACTUAL_PATTERNS; l++) {
                        myPV[i][k][l] += (unsigned short)posDepend[k * HEIGHT + j][l];
                    }
    for (int i = 0; i < 256; i++)
        for (int j = 0; j < 8; j++)
            for (int k = 0; k < ACTUAL_PATTERNS; k++)
                if (myPV[i][j][k] != 0) {
                    pPtr[i][j][pVCount[i][j]] = (unsigned char)k;
                    //opPV[i][j][pVCount[i][j]] = myPV[i][j][k] << 1;
                    myPV[i][j][pVCount[i][j]++] = myPV[i][j][k];
                }
    return true;
}